

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

string * __thiscall
luna::GetTokenStr_abi_cxx11_(string *__return_storage_ptr__,luna *this,TokenDetail *t)

{
  int iVar1;
  ostringstream oss;
  string asStack_1a8 [32];
  string local_188 [11];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = *(int *)(this + 0x18);
  if (iVar1 == 0x117) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::ostream::_M_insert<double>(*(double *)this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_1a8);
    std::__cxx11::string::~string(asStack_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  }
  else if (iVar1 - 0x115U < 2) {
    String::GetStdString_abi_cxx11_(local_188,*(String **)this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_188);
    std::__cxx11::string::~string((string *)local_188);
  }
  else if (iVar1 - 0x100U < 0x1f) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTokenStr(const TokenDetail &t)
    {
        std::string str;

        int token = t.token_;
        if (token == Token_Number)
        {
            std::ostringstream oss;
            oss << t.number_;
            str = oss.str();
        }
        else if (token == Token_Id || token == Token_String)
        {
            str = t.str_->GetStdString();
        }
        else if (token >= Token_And && token <= Token_EOF)
        {
            str = token_str[token - Token_And];
        }
        else
        {
            str.push_back(token);
        }

        return str;
    }